

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O2

void __thiscall leveldb::EnvTest_ReadWrite_Test::TestBody(EnvTest_ReadWrite_Test *this)

{
  Env *pEVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar6;
  Slice read;
  AssertHelper local_110;
  AssertionResult gtest_ar_7;
  int len;
  Random rnd;
  string read_result;
  string scratch;
  WritableFile *writable_file;
  AssertHelper local_a8;
  SequentialFile *sequential_file;
  string data;
  string test_file_name;
  string test_dir;
  
  uVar4 = test::RandomSeed();
  rnd.seed_ = uVar4 & 0x7fffffff;
  if ((rnd.seed_ == 0x7fffffff) || (rnd.seed_ == 0)) {
    rnd.seed_ = 1;
  }
  test_dir._M_dataplus._M_p = (pointer)&test_dir.field_2;
  test_dir._M_string_length = 0;
  test_dir.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x13])(&data,pEVar1,&test_dir);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&test_file_name,
             (char *)&read_result,(Status *)"env_->GetTestDirectory(&test_dir)");
  Status::~Status((Status *)&data);
  if ((char)test_file_name._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&data);
    if (test_file_name._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)test_file_name._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&read_result,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x1f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&read_result,(Message *)&data);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&read_result);
    if (data._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)data._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_file_name._M_string_length);
    goto LAB_0010a0ba;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&test_file_name._M_string_length);
  std::operator+(&test_file_name,&test_dir,"/open_on_read.txt");
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[4])(&read_result,pEVar1,&test_file_name,&writable_file);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&data,(char *)&scratch,
             (Status *)"env_->NewWritableFile(test_file_name, &writable_file)");
  Status::~Status((Status *)&read_result);
  if ((char)data._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&read_result);
    if (data._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)data._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&scratch,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x22,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&scratch,(Message *)&read_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&scratch);
    if (read_result._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)read_result._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&data._M_string_length);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&data._M_string_length);
    data._M_dataplus._M_p = (pointer)&data.field_2;
    data._M_string_length = 0;
    data.field_2._M_local_buf[0] = '\0';
    while (data._M_string_length < 0xa00000) {
      uVar5 = Random::Skewed(&rnd,0x12);
      read_result._M_dataplus._M_p = (pointer)&read_result.field_2;
      read_result._M_string_length = 0;
      read_result.field_2._M_local_buf[0] = '\0';
      test::RandomString(&rnd,uVar5,&read_result);
      read.data_ = read_result._M_dataplus._M_p;
      read.size_ = read_result._M_string_length;
      (*writable_file->_vptr_WritableFile[2])(&gtest_ar_7,writable_file,&read);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&scratch,
                 (char *)&sequential_file,(Status *)"writable_file->Append(r)");
      Status::~Status((Status *)&gtest_ar_7);
      if ((char)scratch._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&read);
        if (scratch._M_string_length == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)scratch._M_string_length;
        }
        iVar2 = 0x2b;
LAB_00109fcc:
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                   ,iVar2,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&read);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
        if (read.data_ != (char *)0x0) {
          (**(code **)(*(long *)read.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&scratch._M_string_length);
        goto LAB_0010a005;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&scratch._M_string_length);
      std::__cxx11::string::append((string *)&data);
      bVar3 = Random::OneIn(&rnd,10);
      if (bVar3) {
        (*writable_file->_vptr_WritableFile[4])(&read);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&scratch,
                   &gtest_ar_7.success_,(Status *)"writable_file->Flush()");
        Status::~Status((Status *)&read);
        if ((char)scratch._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&read);
          if (scratch._M_string_length == 0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)scratch._M_string_length;
          }
          iVar2 = 0x2e;
          goto LAB_00109fcc;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&scratch._M_string_length);
      }
      std::__cxx11::string::_M_dispose();
    }
    (*writable_file->_vptr_WritableFile[5])(&scratch);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&read_result,
               (char *)&read,(Status *)"writable_file->Sync()");
    Status::~Status((Status *)&scratch);
    if ((char)read_result._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&scratch);
      if (read_result._M_string_length == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)read_result._M_string_length;
      }
      iVar2 = 0x31;
LAB_0010a069:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&read,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                 ,iVar2,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&read,(Message *)&scratch);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&read);
      if (scratch._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)scratch._M_dataplus._M_p + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&read_result._M_string_length);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&read_result._M_string_length);
      (*writable_file->_vptr_WritableFile[3])(&scratch);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&read_result,
                 (char *)&read,(Status *)"writable_file->Close()");
      Status::~Status((Status *)&scratch);
      if ((char)read_result._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&scratch);
        if (read_result._M_string_length == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)read_result._M_string_length;
        }
        iVar2 = 0x32;
        goto LAB_0010a069;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&read_result._M_string_length);
      if (writable_file != (WritableFile *)0x0) {
        (*writable_file->_vptr_WritableFile[1])();
      }
      pEVar1 = (this->super_EnvTest).env_;
      (*pEVar1->_vptr_Env[2])(&scratch,pEVar1,&test_file_name,&sequential_file);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&read_result,
                 (char *)&read,(Status *)"env_->NewSequentialFile(test_file_name, &sequential_file)"
                );
      Status::~Status((Status *)&scratch);
      if ((char)read_result._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&scratch);
        if (read_result._M_string_length == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)read_result._M_string_length;
        }
        iVar2 = 0x37;
        goto LAB_0010a069;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&read_result._M_string_length);
      read_result._M_dataplus._M_p = (pointer)&read_result.field_2;
      read_result._M_string_length = 0;
      scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
      scratch._M_string_length = 0;
      read_result.field_2._M_local_buf[0] = '\0';
      scratch.field_2._M_local_buf[0] = '\0';
      pcVar6 = "";
      while (read_result._M_string_length < data._M_string_length) {
        uVar5 = Random::Skewed(&rnd,0x12);
        len = (int)data._M_string_length - (int)read_result._M_string_length;
        if ((int)uVar5 < (int)data._M_string_length - (int)read_result._M_string_length) {
          len = uVar5;
        }
        std::__cxx11::string::resize((ulong)&scratch);
        read.data_ = "";
        read.size_ = 0;
        (*sequential_file->_vptr_SequentialFile[2])
                  (&local_110,sequential_file,(long)len,&read,scratch._M_dataplus._M_p);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&gtest_ar_7,
                   (char *)&local_a8,(Status *)"sequential_file->Read(len, &read, &scratch[0])");
        Status::~Status((Status *)&local_110);
        if (gtest_ar_7.success_ == false) {
          testing::Message::Message((Message *)&local_110);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          iVar2 = 0x3e;
LAB_0010a24c:
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                     ,iVar2,pcVar6);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if (local_110.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_110.data_ + 8))();
          }
          this_00 = &gtest_ar_7.message_;
          goto LAB_0010a280;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_7.message_);
        if (0 < len) {
          local_110.data_ = (AssertHelperData *)read.size_;
          local_a8.data_._0_4_ = 0;
          testing::internal::CmpHelperGT<unsigned_long,int>
                    ((internal *)&gtest_ar_7,"read.size()","0",(unsigned_long *)&local_110,
                     (int *)&local_a8);
          if (gtest_ar_7.success_ == false) {
            testing::Message::Message((Message *)&local_110);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_7.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)gtest_ar_7.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            iVar2 = 0x40;
            goto LAB_0010a24c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_7.message_);
        }
        local_110.data_ = (AssertHelperData *)read.size_;
        testing::internal::CmpHelperLE<unsigned_long,int>
                  ((internal *)&gtest_ar_7,"read.size()","len",(unsigned_long *)&local_110,&len);
        if (gtest_ar_7.success_ == false) {
          testing::Message::Message((Message *)&local_110);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          iVar2 = 0x42;
          goto LAB_0010a24c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_7.message_);
        std::__cxx11::string::append((char *)&read_result,(ulong)read.data_);
      }
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&read,"read_result","data",&read_result,&data);
      if ((char)read.data_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_7);
        if (read.size_ != 0) {
          pcVar6 = *(char **)read.size_;
        }
        this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&read.size_;
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                   ,0x45,pcVar6);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&gtest_ar_7);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if ((long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_) + 8))();
        }
LAB_0010a280:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_00);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&read.size_);
        if (sequential_file != (SequentialFile *)0x0) {
          (*sequential_file->_vptr_SequentialFile[1])();
        }
      }
      std::__cxx11::string::_M_dispose();
LAB_0010a005:
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
LAB_0010a0ba:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TEST_F(EnvTest, ReadWrite) {
  Random rnd(test::RandomSeed());

  // Get file to use for testing.
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/open_on_read.txt";
  WritableFile* writable_file;
  ASSERT_LEVELDB_OK(env_->NewWritableFile(test_file_name, &writable_file));

  // Fill a file with data generated via a sequence of randomly sized writes.
  static const size_t kDataSize = 10 * 1048576;
  std::string data;
  while (data.size() < kDataSize) {
    int len = rnd.Skewed(18);  // Up to 2^18 - 1, but typically much smaller
    std::string r;
    test::RandomString(&rnd, len, &r);
    ASSERT_LEVELDB_OK(writable_file->Append(r));
    data += r;
    if (rnd.OneIn(10)) {
      ASSERT_LEVELDB_OK(writable_file->Flush());
    }
  }
  ASSERT_LEVELDB_OK(writable_file->Sync());
  ASSERT_LEVELDB_OK(writable_file->Close());
  delete writable_file;

  // Read all data using a sequence of randomly sized reads.
  SequentialFile* sequential_file;
  ASSERT_LEVELDB_OK(env_->NewSequentialFile(test_file_name, &sequential_file));
  std::string read_result;
  std::string scratch;
  while (read_result.size() < data.size()) {
    int len = std::min<int>(rnd.Skewed(18), data.size() - read_result.size());
    scratch.resize(std::max(len, 1));  // at least 1 so &scratch[0] is legal
    Slice read;
    ASSERT_LEVELDB_OK(sequential_file->Read(len, &read, &scratch[0]));
    if (len > 0) {
      ASSERT_GT(read.size(), 0);
    }
    ASSERT_LE(read.size(), len);
    read_result.append(read.data(), read.size());
  }
  ASSERT_EQ(read_result, data);
  delete sequential_file;
}